

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O2

void pcut_print_tests(pcut_item_t *first)

{
  int iVar1;
  pcut_item_t *item;
  char *__format;
  
  item = pcut_get_real(first);
  do {
    if (item == (pcut_item_t *)0x0) {
      return;
    }
    iVar1 = item->kind;
    if (1 < iVar1 - 2U) {
      __format = "  Suite `%s\' [%d]\n";
      if (iVar1 != 4) {
        if (iVar1 != 5) {
          __assert_fail("0 && \"unreachable case in item-kind switch\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/vhotspur[P]pcut/src/print.c"
                        ,0x5c,"void pcut_print_tests(pcut_item_t *)");
        }
        __format = "    Test `%s\' [%d]\n";
      }
      printf(__format,item->name,(ulong)(uint)item->id);
    }
    item = pcut_get_real_next(item);
  } while( true );
}

Assistant:

void pcut_print_tests(pcut_item_t *first) {
	pcut_item_t *it;
	for (it = pcut_get_real(first); it != NULL; it = pcut_get_real_next(it)) {
		switch (it->kind) {
		case PCUT_KIND_TESTSUITE:
			printf("  Suite `%s' [%d]\n", it->name, it->id);
			break;
		case PCUT_KIND_TEST:
			printf("    Test `%s' [%d]\n", it->name, it->id);
			break;
		case PCUT_KIND_SETUP:
		case PCUT_KIND_TEARDOWN:
			/* Fall-through, do nothing. */
			break;
		default:
			assert(0 && "unreachable case in item-kind switch");
			break;
		}
	}
}